

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStaticAnalysis.cpp
# Opt level: O3

void __thiscall
chrono::ChStaticNonLinearAnalysis::ChStaticNonLinearAnalysis
          (ChStaticNonLinearAnalysis *this,ChIntegrableIIorder *integrable)

{
  ChStaticAnalysis::ChStaticAnalysis(&this->super_ChStaticAnalysis,integrable);
  (this->super_ChStaticAnalysis)._vptr_ChStaticAnalysis =
       (_func_int **)&PTR__ChStaticAnalysis_00b44218;
  this->m_verbose = false;
  this->m_maxiters = 0x14;
  this->m_incremental_steps = 6;
  this->m_use_correction_test = true;
  this->m_reltol = 0.0001;
  this->m_abstol = 1e-08;
  return;
}

Assistant:

ChStaticNonLinearAnalysis::ChStaticNonLinearAnalysis(ChIntegrableIIorder& integrable)
    : ChStaticAnalysis(integrable),
      m_maxiters(20),
      m_incremental_steps(6),
      m_use_correction_test(true),
      m_reltol(1e-4),
      m_abstol(1e-8),
      m_verbose(false) {}